

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O3

void __thiscall ipx::BasicLu::Reallocate(BasicLu *this)

{
  double dVar1;
  pointer pdVar2;
  size_type sVar3;
  
  pdVar2 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0.0 < pdVar2[0x42]) {
    dVar1 = (double)(int)(pdVar2[0x42] + pdVar2[1]) * 1.5;
    sVar3 = (size_type)(int)dVar1;
    std::vector<int,_std::allocator<int>_>::resize(&this->Li_,sVar3);
    std::vector<double,_std::allocator<double>_>::resize(&this->Lx_,sVar3);
    pdVar2 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[1] = (double)(int)dVar1;
  }
  if (0.0 < pdVar2[0x43]) {
    dVar1 = (double)(int)(pdVar2[0x43] + pdVar2[2]) * 1.5;
    sVar3 = (size_type)(int)dVar1;
    std::vector<int,_std::allocator<int>_>::resize(&this->Ui_,sVar3);
    std::vector<double,_std::allocator<double>_>::resize(&this->Ux_,sVar3);
    pdVar2 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[2] = (double)(int)dVar1;
  }
  if (0.0 < pdVar2[0x44]) {
    dVar1 = (double)(int)(pdVar2[0x44] + pdVar2[3]) * 1.5;
    sVar3 = (size_type)(int)dVar1;
    std::vector<int,_std::allocator<int>_>::resize(&this->Wi_,sVar3);
    std::vector<double,_std::allocator<double>_>::resize(&this->Wx_,sVar3);
    (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[3] = (double)(int)dVar1;
  }
  return;
}

Assistant:

void BasicLu::Reallocate() {
    assert(Li_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYL]));
    assert(Lx_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYL]));
    assert(Ui_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYU]));
    assert(Ux_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYU]));
    assert(Wi_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYW]));
    assert(Wx_.size() == static_cast<size_t>(xstore_[BASICLU_MEMORYW]));

    if (xstore_[BASICLU_ADD_MEMORYL] > 0) {
        Int new_size = xstore_[BASICLU_MEMORYL] + xstore_[BASICLU_ADD_MEMORYL];
        new_size *= kReallocFactor;
        Li_.resize(new_size);
        Lx_.resize(new_size);
        xstore_[BASICLU_MEMORYL] = new_size;
    }
    if (xstore_[BASICLU_ADD_MEMORYU] > 0) {
        Int new_size = xstore_[BASICLU_MEMORYU] + xstore_[BASICLU_ADD_MEMORYU];
        new_size *= kReallocFactor;
        Ui_.resize(new_size);
        Ux_.resize(new_size);
        xstore_[BASICLU_MEMORYU] = new_size;
    }
    if (xstore_[BASICLU_ADD_MEMORYW] > 0) {
        Int new_size = xstore_[BASICLU_MEMORYW] + xstore_[BASICLU_ADD_MEMORYW];
        new_size *= kReallocFactor;
        Wi_.resize(new_size);
        Wx_.resize(new_size);
        xstore_[BASICLU_MEMORYW] = new_size;
    }
}